

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  byte bVar1;
  byte bVar2;
  int *__s;
  char *pIn;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  byte *z;
  sqlite3_vtab *psVar7;
  long lVar8;
  void *__dest;
  bool bVar9;
  int rc;
  int rc_1;
  int local_60;
  int local_5c;
  sqlite3_vtab **local_58;
  sqlite3 *local_50;
  char *local_48;
  char *local_40;
  sqlite3_module *local_38;
  
  local_60 = 0;
  local_50 = db;
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar4 = strlen((char *)__s);
    if (sVar4 != 4) goto LAB_001d9f56;
    bVar9 = *__s == 0x706d6574;
  }
  else {
LAB_001d9f56:
    bVar9 = false;
  }
  if ((argc != 5) && (bVar9 == false)) {
    psVar7 = (sqlite3_vtab *)0x0;
    pcVar5 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar5;
    local_60 = 1;
    goto LAB_001da1c2;
  }
  pcVar5 = argv[(ulong)bVar9 + 3];
  pIn = argv[(ulong)bVar9 + 4];
  local_40 = argv[(ulong)bVar9 * 2 + 1];
  local_58 = ppVTab;
  local_38 = (sqlite3_module *)pAux;
  sVar4 = strlen(local_40);
  local_48 = pcVar5;
  sVar6 = strlen(pcVar5);
  local_5c = 0;
  z = (byte *)sqlite3Fts5Strndup(&local_5c,pIn,-1);
  lVar8 = 0;
  if (local_5c == 0) {
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    lVar8 = 0;
    do {
      bVar1 = z[lVar8];
      bVar2 = "locking protocol"[lVar8 + 0xd];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001da043;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001da043;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  goto LAB_001da0e5;
LAB_001da043:
  lVar8 = 0;
  if (bVar1 != bVar2) {
    lVar8 = 0;
    do {
      bVar1 = z[lVar8];
      bVar2 = "row"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001da07c;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001da07c;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  goto LAB_001da0dd;
LAB_001da0b4:
  lVar8 = 2;
  if (bVar1 != bVar2) {
    lVar8 = 0;
    pcVar5 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",z);
    *pzErr = pcVar5;
    local_5c = 1;
  }
  goto LAB_001da0dd;
LAB_001da07c:
  lVar8 = 1;
  if (bVar1 != bVar2) {
    lVar8 = 0;
    do {
      bVar1 = z[lVar8];
      bVar2 = "instance"[lVar8];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001da0b4;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001da0b4;
      lVar8 = lVar8 + 1;
    } while( true );
  }
LAB_001da0dd:
  sqlite3_free(z);
LAB_001da0e5:
  local_60 = local_5c;
  if (local_5c == 0) {
    local_60 = sqlite3_declare_vtab
                         (local_50,(char *)((long)&DAT_001e5080 + (long)(int)(&DAT_001e5080)[lVar8])
                         );
  }
  psVar7 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_60,(long)((int)sVar4 + (int)sVar6 + 0x42));
  ppVTab = local_58;
  if (psVar7 != (sqlite3_vtab *)0x0) {
    sVar6 = (size_t)((int)sVar6 + 1);
    psVar7[2].pModule = local_38;
    psVar7[2].nRef = (int)lVar8;
    psVar7[1].zErrMsg = (char *)local_50;
    psVar7[1].pModule = (sqlite3_module *)&psVar7[2].zErrMsg;
    __dest = (void *)((long)&psVar7[2].zErrMsg + sVar6);
    *(void **)&psVar7[1].nRef = __dest;
    memcpy(&psVar7[2].zErrMsg,local_48,sVar6);
    memcpy(__dest,local_40,(long)((int)sVar4 + 1));
    uVar3 = (byte)(psVar7[1].pModule)->iVersion - 0x22;
    if ((uVar3 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)psVar7[1].pModule);
    }
    uVar3 = **(byte **)&psVar7[1].nRef - 0x22;
    ppVTab = local_58;
    if ((uVar3 < 0x3f) && ((0x4200000000000021U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)*(byte **)&psVar7[1].nRef);
      ppVTab = local_58;
    }
  }
LAB_001da1c2:
  *ppVTab = psVar7;
  return local_60;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = { 
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")", 
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1; 
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;
    
    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}